

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase957::run(TestCase957 *this)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  PromiseBase PVar2;
  undefined8 uVar3;
  void *pvVar4;
  PromiseNode *ptrCopy;
  OwnPromiseNode OVar5;
  TransformPromiseNodeBase *this_00;
  int counter;
  DebugComparison<int,_int_&> _kjCondition;
  WaitScope waitScope;
  ErrorHandlerImpl errorHandler;
  TaskSet tasks;
  EventLoop loop;
  PromiseBase local_178;
  undefined1 local_16c [4];
  DebugComparison<unsigned_int,_unsigned_int_&> local_168;
  EventLoop *local_140;
  byte local_138 [8];
  long local_130;
  byte abStack_128 [8];
  char *local_120;
  char *pcStack_118;
  byte local_110 [8];
  char *local_108;
  char *pcStack_100;
  byte local_f8 [8];
  ErrorHandler local_f0;
  uint local_e8 [2];
  TaskSet local_e0;
  EventLoop local_a8;
  
  EventLoop::EventLoop(&local_a8);
  local_138[0] = 0xff;
  local_138[1] = 0xff;
  local_138[2] = 0xff;
  local_138[3] = 0xff;
  local_130 = 0;
  abStack_128[0] = '\0';
  abStack_128[1] = '\0';
  abStack_128[2] = '\0';
  abStack_128[3] = '\0';
  abStack_128[4] = '\0';
  abStack_128[5] = '\0';
  abStack_128[6] = '\0';
  abStack_128[7] = '\0';
  local_140 = &local_a8;
  EventLoop::enterScope(&local_a8);
  local_f0._vptr_ErrorHandler = (_func_int **)&PTR_taskFailed_00627a60;
  local_e8[0] = 0;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_100 = "run";
  local_f8[0] = 0xc1;
  local_f8[1] = '\x03';
  local_f8[2] = '\0';
  local_f8[3] = '\0';
  local_f8[4] = '\v';
  local_f8[5] = '\0';
  local_f8[6] = '\0';
  local_f8[7] = '\0';
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x3c1;
  location.columnNumber = 0xb;
  TaskSet::TaskSet(&local_e0,&local_f0,location);
  local_16c = (undefined1  [4])0x0;
  yield();
  uVar3 = local_168._0_8_;
  pPVar1 = *(PromiseArena **)(local_168._0_8_ + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_168._0_8_ - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    OVar5.ptr = (PromiseNode *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)OVar5.ptr,(OwnPromiseNode *)&local_168,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:965:23)>
               ::anon_class_8_1_bc7188dc_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00627a90;
    *(undefined1 **)((long)pvVar4 + 0x3f8) = local_16c;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    *(PromiseArena **)(local_168._0_8_ + 8) = (PromiseArena *)0x0;
    OVar5.ptr = (PromiseNode *)&((PromiseArenaMember *)(local_168._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)OVar5.ptr,(OwnPromiseNode *)&local_168,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:965:23)>
               ::anon_class_8_1_bc7188dc_for_func::operator());
    ((PromiseArenaMember *)(uVar3 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00627a90;
    ((PromiseArenaMember *)(uVar3 + -0x10))->arena = (PromiseArena *)local_16c;
    ((PromiseArenaMember *)(uVar3 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar3 = local_168._0_8_;
  local_178.node.ptr = (OwnPromiseNode)(OwnPromiseNode)OVar5.ptr;
  if ((PromiseArenaMember *)local_168._0_8_ != (PromiseArenaMember *)0x0) {
    local_168._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  TaskSet::add(&local_e0,(Promise<void> *)&local_178);
  PVar2.node.ptr = local_178.node.ptr;
  if (local_178.node.ptr != (PromiseNode *)0x0) {
    local_178.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar2.node.ptr);
  }
  yield();
  uVar3 = local_168._0_8_;
  pPVar1 = *(PromiseArena **)(local_168._0_8_ + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_168._0_8_ - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    OVar5.ptr = (PromiseNode *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)OVar5.ptr,(OwnPromiseNode *)&local_168,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:968:23)>
               ::anon_class_8_1_bc7188dc_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00627ae8;
    *(undefined1 **)((long)pvVar4 + 0x3f8) = local_16c;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    *(PromiseArena **)(local_168._0_8_ + 8) = (PromiseArena *)0x0;
    OVar5.ptr = (PromiseNode *)&((PromiseArenaMember *)(local_168._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)OVar5.ptr,(OwnPromiseNode *)&local_168,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:968:23)>
               ::anon_class_8_1_bc7188dc_for_func::operator());
    ((PromiseArenaMember *)(uVar3 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00627ae8;
    ((PromiseArenaMember *)(uVar3 + -0x10))->arena = (PromiseArena *)local_16c;
    ((PromiseArenaMember *)(uVar3 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar3 = local_168._0_8_;
  local_178.node.ptr = (OwnPromiseNode)(OwnPromiseNode)OVar5.ptr;
  if ((PromiseArenaMember *)local_168._0_8_ != (PromiseArenaMember *)0x0) {
    local_168._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  TaskSet::add(&local_e0,(Promise<void> *)&local_178);
  PVar2.node.ptr = local_178.node.ptr;
  if (local_178.node.ptr != (PromiseNode *)0x0) {
    local_178.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar2.node.ptr);
  }
  yield();
  uVar3 = local_168._0_8_;
  pPVar1 = *(PromiseArena **)(local_168._0_8_ + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_168._0_8_ - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    OVar5.ptr = (PromiseNode *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)OVar5.ptr,(OwnPromiseNode *)&local_168,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:972:23)>
               ::anon_class_8_1_bc7188dc_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00627b40;
    *(undefined1 **)((long)pvVar4 + 0x3f8) = local_16c;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    *(PromiseArena **)(local_168._0_8_ + 8) = (PromiseArena *)0x0;
    OVar5.ptr = (PromiseNode *)&((PromiseArenaMember *)(local_168._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)OVar5.ptr,(OwnPromiseNode *)&local_168,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:972:23)>
               ::anon_class_8_1_bc7188dc_for_func::operator());
    ((PromiseArenaMember *)(uVar3 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00627b40;
    ((PromiseArenaMember *)(uVar3 + -0x10))->arena = (PromiseArena *)local_16c;
    ((PromiseArenaMember *)(uVar3 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar3 = local_168._0_8_;
  local_178.node.ptr = (OwnPromiseNode)(OwnPromiseNode)OVar5.ptr;
  if ((PromiseArenaMember *)local_168._0_8_ != (PromiseArenaMember *)0x0) {
    local_168._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  TaskSet::add(&local_e0,(Promise<void> *)&local_178);
  PVar2.node.ptr = local_178.node.ptr;
  if (local_178.node.ptr != (PromiseNode *)0x0) {
    local_178.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar2.node.ptr);
  }
  yield();
  uVar3 = local_168._0_8_;
  pPVar1 = *(PromiseArena **)(local_168._0_8_ + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_168._0_8_ - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_168,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:976:37)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00627b98;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    *(PromiseArena **)(local_168._0_8_ + 8) = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&((PromiseArenaMember *)(local_168._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_168,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:976:37)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar3 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00627b98;
    ((PromiseArenaMember *)(uVar3 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar3 = local_168._0_8_;
  if ((PromiseArenaMember *)local_168._0_8_ != (PromiseArenaMember *)0x0) {
    local_168._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  yield();
  uVar3 = local_168._0_8_;
  pPVar1 = *(PromiseArena **)(local_168._0_8_ + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_168._0_8_ - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    OVar5.ptr = (PromiseNode *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)OVar5.ptr,(OwnPromiseNode *)&local_168,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:980:13)>
               ::anon_class_8_1_bc7188dc_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00627bf0;
    *(undefined1 **)((long)pvVar4 + 0x3f8) = local_16c;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    *(PromiseArena **)(local_168._0_8_ + 8) = (PromiseArena *)0x0;
    OVar5.ptr = (PromiseNode *)&((PromiseArenaMember *)(local_168._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)OVar5.ptr,(OwnPromiseNode *)&local_168,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:980:13)>
               ::anon_class_8_1_bc7188dc_for_func::operator());
    ((PromiseArenaMember *)(uVar3 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00627bf0;
    ((PromiseArenaMember *)(uVar3 + -0x10))->arena = (PromiseArena *)local_16c;
    ((PromiseArenaMember *)(uVar3 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar3 = local_168._0_8_;
  local_178.node.ptr = (OwnPromiseNode)(OwnPromiseNode)OVar5.ptr;
  if ((PromiseArenaMember *)local_168._0_8_ != (PromiseArenaMember *)0x0) {
    local_168._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_118 = "run";
  local_110[0] = 0xd4;
  local_110[1] = '\x03';
  local_110[2] = '\0';
  local_110[3] = '\0';
  local_110[4] = '\x03';
  local_110[5] = '\0';
  local_110[6] = '\0';
  local_110[7] = '\0';
  Promise<void>::wait((Promise<void> *)&local_178,&local_140);
  PVar2.node.ptr = local_178.node.ptr;
  if (local_178.node.ptr != (PromiseNode *)0x0) {
    local_178.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar2.node.ptr);
  }
  local_168.right = (uint *)local_16c;
  local_168.result = local_16c == (undefined1  [4])0x4;
  local_168.left = 4;
  local_168.op.content.ptr = " == ";
  local_168.op.content.size_ = 5;
  if ((!local_168.result) && (kj::_::Debug::minSeverity < 3)) {
    local_178.node.ptr._0_4_ = 4;
    kj::_::Debug::log<char_const(&)[34],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x3d8,ERROR,"\"failed: expected \" \"(4) == (counter)\", _kjCondition, 4, counter",
               (char (*) [34])"failed: expected (4) == (counter)",
               (DebugComparison<int,_int_&> *)&local_168,(int *)&local_178,(int *)local_168.right);
  }
  local_168.right = local_e8;
  local_168.result = local_e8[0] == 1;
  local_168.left = 1;
  local_168.op.content.ptr = " == ";
  local_168.op.content.size_ = 5;
  if ((!local_168.result) && (kj::_::Debug::minSeverity < 3)) {
    local_178.node.ptr._0_4_ = 1;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int&>&,unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x3d9,ERROR,
               "\"failed: expected \" \"(1u) == (errorHandler.exceptionCount)\", _kjCondition, 1u, errorHandler.exceptionCount"
               ,(char (*) [55])"failed: expected (1u) == (errorHandler.exceptionCount)",&local_168,
               (uint *)&local_178,local_168.right);
  }
  kj::_::PromiseDisposer::dispose((PromiseArenaMember *)this_00);
  TaskSet::~TaskSet(&local_e0);
  if (local_130 == 0) {
    EventLoop::leaveScope(local_140);
  }
  EventLoop::~EventLoop(&local_a8);
  return;
}

Assistant:

TEST(Async, TaskSet) {
  EventLoop loop;
  WaitScope waitScope(loop);
  ErrorHandlerImpl errorHandler;
  TaskSet tasks(errorHandler);

  int counter = 0;

  tasks.add(evalLater([&]() {
    EXPECT_EQ(0, counter++);
  }));
  tasks.add(evalLater([&]() {
    EXPECT_EQ(1, counter++);
    KJ_FAIL_ASSERT("example TaskSet failure") { break; }
  }));
  tasks.add(evalLater([&]() {
    EXPECT_EQ(2, counter++);
  }));

  auto ignore KJ_UNUSED = evalLater([&]() {
    KJ_FAIL_EXPECT("Promise without waiter shouldn't execute.");
  });

  evalLater([&]() {
    EXPECT_EQ(3, counter++);
  }).wait(waitScope);

  EXPECT_EQ(4, counter);
  EXPECT_EQ(1u, errorHandler.exceptionCount);
}